

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

int Cudd_ClassifySupport
              (DdManager *dd,DdNode *f,DdNode *g,DdNode **common,DdNode **onlyF,DdNode **onlyG)

{
  int *piVar1;
  bool bVar2;
  uint index;
  int *support;
  int *support_00;
  DdNode *pDVar3;
  DdNode *pDVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  DdNode **ppDVar10;
  
  uVar6 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar6 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar6 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    support_00 = (int *)malloc((long)(int)uVar6 << 2);
    if (support_00 != (int *)0x0) {
      uVar5 = (ulong)uVar6;
      if (0 < (int)uVar6) {
        memset(support,0,uVar5 * 4);
        memset(support_00,0,uVar5 * 4);
      }
      ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support);
      ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
      ddSupportStep((DdNode *)((ulong)g & 0xfffffffffffffffe),support_00);
      ddClearFlag((DdNode *)((ulong)g & 0xfffffffffffffffe));
      pDVar3 = dd->one;
      *onlyG = pDVar3;
      *onlyF = pDVar3;
      *common = pDVar3;
      uVar7 = (ulong)pDVar3 & 0xfffffffffffffffe;
      *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
      uVar8 = (ulong)*onlyF & 0xfffffffffffffffe;
      *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + 1;
      uVar9 = (ulong)*onlyG & 0xfffffffffffffffe;
      *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
      if (0 < (int)uVar6) {
        do {
          uVar6 = uVar6 - 1;
          index = uVar6;
          if ((long)uVar5 <= (long)dd->size) {
            index = dd->invperm[uVar5 - 1];
          }
          if ((support[(int)index] != 0) || (support_00[(int)index] != 0)) {
            pDVar3 = cuddUniqueInter(dd,index,dd->one,(DdNode *)((ulong)dd->one ^ 1));
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            if (support_00[(int)index] == 0) {
              pDVar4 = Cudd_bddAnd(dd,*onlyF,pDVar3);
              if (pDVar4 != (DdNode *)0x0) {
                piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                Cudd_RecursiveDeref(dd,*onlyF);
                *onlyF = pDVar4;
LAB_00803550:
                Cudd_RecursiveDeref(dd,pDVar3);
                goto LAB_0080356f;
              }
              Cudd_RecursiveDeref(dd,*common);
              Cudd_RecursiveDeref(dd,*onlyF);
              Cudd_RecursiveDeref(dd,*onlyG);
            }
            else {
              if (support[(int)index] == 0) {
                pDVar4 = Cudd_bddAnd(dd,*onlyG,pDVar3);
                ppDVar10 = onlyG;
                if (pDVar4 != (DdNode *)0x0) goto LAB_00803538;
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                pDVar4 = *onlyG;
              }
              else {
                pDVar4 = Cudd_bddAnd(dd,*common,pDVar3);
                ppDVar10 = common;
                if (pDVar4 != (DdNode *)0x0) {
LAB_00803538:
                  piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  Cudd_RecursiveDeref(dd,*ppDVar10);
                  *ppDVar10 = pDVar4;
                  goto LAB_00803550;
                }
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                pDVar4 = *onlyG;
              }
              Cudd_RecursiveDeref(dd,pDVar4);
            }
            Cudd_RecursiveDeref(dd,pDVar3);
            free(support);
            support = support_00;
            goto LAB_00803688;
          }
LAB_0080356f:
          bVar2 = 1 < uVar5;
          uVar5 = uVar5 - 1;
        } while (bVar2);
        uVar7 = (ulong)*common & 0xfffffffffffffffe;
        uVar8 = (ulong)*onlyF & 0xfffffffffffffffe;
        uVar9 = (ulong)*onlyG & 0xfffffffffffffffe;
      }
      free(support);
      free(support_00);
      *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + -1;
      *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + -1;
      *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + -1;
      return 1;
    }
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_00803688:
    free(support);
  }
  return 0;
}

Assistant:

int
Cudd_ClassifySupport(
  DdManager * dd /* manager */,
  DdNode * f /* first DD */,
  DdNode * g /* second DD */,
  DdNode ** common /* cube of shared variables */,
  DdNode ** onlyF /* cube of variables only in f */,
  DdNode ** onlyG /* cube of variables only in g */)
{
    int *supportF, *supportG;
    DdNode *tmp, *var;
    int i,j;
    int size;

    /* Allocate and initialize support arrays for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    supportF = ABC_ALLOC(int,size);
    if (supportF == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    supportG = ABC_ALLOC(int,size);
    if (supportG == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(supportF);
        return(0);
    }
    for (i = 0; i < size; i++) {
        supportF[i] = 0;
        supportG[i] = 0;
    }

    /* Compute supports and clean up markers. */
    ddSupportStep(Cudd_Regular(f),supportF);
    ddClearFlag(Cudd_Regular(f));
    ddSupportStep(Cudd_Regular(g),supportG);
    ddClearFlag(Cudd_Regular(g));

    /* Classify variables and create cubes. */
    *common = *onlyF = *onlyG = DD_ONE(dd);
    cuddRef(*common); cuddRef(*onlyF); cuddRef(*onlyG);
    for (j = size - 1; j >= 0; j--) { /* for each level bottom-up */
        i = (j >= dd->size) ? j : dd->invperm[j];
        if (supportF[i] == 0 && supportG[i] == 0) continue;
        var = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
        cuddRef(var);
        if (supportG[i] == 0) {
            tmp = Cudd_bddAnd(dd,*onlyF,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*onlyF);
            *onlyF = tmp;
        } else if (supportF[i] == 0) {
            tmp = Cudd_bddAnd(dd,*onlyG,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*onlyG);
            *onlyG = tmp;
        } else {
            tmp = Cudd_bddAnd(dd,*common,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*common);
            *common = tmp;
        }
        Cudd_RecursiveDeref(dd,var);
    }

    ABC_FREE(supportF); ABC_FREE(supportG);
    cuddDeref(*common); cuddDeref(*onlyF); cuddDeref(*onlyG);
    return(1);

}